

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

void __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::Value,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<duckdb::Value,_true> *ret)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined6 in_register_00000032;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> __tmp;
  pointer local_98;
  pointer pVStack_90;
  pointer local_88;
  Value local_78;
  
  uVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)uVar1 == '\0') {
    local_98 = (pointer)0x0;
    pVStack_90 = (pointer)0x0;
    local_88 = (pointer)0x0;
    local_78.type_._0_4_ =
         *(undefined4 *)
          &(ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
    local_78.type_._4_4_ =
         *(undefined4 *)
          ((long)&(ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_start + 4);
    uVar4 = *(undefined4 *)
             &(ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar5 = *(undefined4 *)
             ((long)&(ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4);
    local_78.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_98 = (pointer)0x0;
    pVStack_90 = (pointer)0x0;
    local_88 = (pointer)0x0;
    iVar2 = (*this->_vptr_Deserializer[8])(this);
    lVar3 = CONCAT44(extraout_var,iVar2);
    if (lVar3 != 0) {
      do {
        (*this->_vptr_Deserializer[6])(this);
        Value::Deserialize(&local_78,this);
        (*this->_vptr_Deserializer[7])(this);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_98,&local_78);
        Value::~Value(&local_78);
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    (*this->_vptr_Deserializer[9])(this);
    local_78.type_._0_4_ =
         *(undefined4 *)
          &(ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
    local_78.type_._4_4_ =
         *(undefined4 *)
          ((long)&(ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_start + 4);
    uVar4 = *(undefined4 *)
             &(ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar5 = *(undefined4 *)
             ((long)&(ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4);
    local_78.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_98;
  (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_90;
  (ret->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_88;
  local_78.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT44(uVar5,uVar4);
  local_98 = (pointer)0x0;
  pVStack_90 = (pointer)0x0;
  local_88 = (pointer)0x0;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_78);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_98);
  (*this->_vptr_Deserializer[5])(this,(ulong)(uVar1 & 0xff));
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}